

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

AttVal * prvTidyAddAttribute(TidyDocImpl *doc,Node *node,ctmbstr name,ctmbstr value)

{
  AttVal *av;
  tmbstr ptVar1;
  Attribute *pAVar2;
  
  av = prvTidyNewAttribute(doc);
  av->delim = 0x22;
  ptVar1 = prvTidytmbstrdup(doc->allocator,name);
  av->attribute = ptVar1;
  if (value == (ctmbstr)0x0) {
    ptVar1 = (tmbstr)0x0;
  }
  else {
    ptVar1 = prvTidytmbstrdup(doc->allocator,value);
  }
  av->value = ptVar1;
  pAVar2 = attrsLookup(doc,&doc->attribs,name);
  av->dict = pAVar2;
  prvTidyInsertAttributeAtEnd(node,av);
  return av;
}

Assistant:

AttVal* TY_(AddAttribute)( TidyDocImpl* doc,
                           Node *node, ctmbstr name, ctmbstr value )
{
    AttVal *av = TY_(NewAttribute)(doc);
    av->delim = '"';
    av->attribute = TY_(tmbstrdup)(doc->allocator, name);

    if (value)
        av->value = TY_(tmbstrdup)(doc->allocator, value);
    else
        av->value = NULL;

    av->dict = attrsLookup(doc, &doc->attribs, name);

    TY_(InsertAttributeAtEnd)(node, av);
    return av;
}